

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

void trace_flushroot(jit_State *J,GCtrace *T)

{
  ushort uVar1;
  uint uVar2;
  uint *puVar3;
  TraceNo1 *pTVar4;
  uint64_t uVar5;
  uint uVar6;
  
  uVar5 = (T->startpt).gcptr64;
  uVar2 = T->startins;
  if ((char)uVar2 != 'X') {
    puVar3 = (uint *)(T->startpc).ptr64;
    switch(*puVar3 & 0xff) {
    case 0x51:
      *puVar3 = uVar2;
      *(undefined1 *)(puVar3 + -0x8000 + *(ushort *)((long)&T->startins + 2)) = 0x4d;
      break;
    case 0x54:
    case 0x57:
    case 0x5b:
      *puVar3 = uVar2;
      break;
    case 0x58:
      uVar6 = *puVar3 >> 0x10;
      if ((char)(puVar3 + -0x7ffe)[uVar6] == 'T') {
        (puVar3 + -0x7ffe)[uVar6] = uVar2;
      }
    }
  }
  uVar1 = *(ushort *)(uVar5 + 0x3e);
  if (uVar1 == T->traceno) {
    pTVar4 = (TraceNo1 *)(uVar5 + 0x3e);
LAB_00126d6e:
    *pTVar4 = T->nextroot;
  }
  else if ((ulong)uVar1 != 0) {
    uVar5 = J->trace[uVar1].gcptr64;
    if (uVar5 != 0) {
      while( true ) {
        uVar1 = *(ushort *)(uVar5 + 0x6e);
        if ((ulong)uVar1 == 0) break;
        if (uVar1 == T->traceno) {
          pTVar4 = (TraceNo1 *)(uVar5 + 0x6e);
          goto LAB_00126d6e;
        }
        uVar5 = J->trace[uVar1].gcptr64;
      }
    }
  }
  return;
}

Assistant:

static void trace_flushroot(jit_State *J, GCtrace *T)
{
  GCproto *pt = &gcref(T->startpt)->pt;
  lj_assertJ(T->root == 0, "not a root trace");
  lj_assertJ(pt != NULL, "trace has no prototype");
  /* First unpatch any modified bytecode. */
  trace_unpatch(J, T);
  /* Unlink root trace from chain anchored in prototype. */
  if (pt->trace == T->traceno) {  /* Trace is first in chain. Easy. */
    pt->trace = T->nextroot;
  } else if (pt->trace) {  /* Otherwise search in chain of root traces. */
    GCtrace *T2 = traceref(J, pt->trace);
    if (T2) {
      for (; T2->nextroot; T2 = traceref(J, T2->nextroot))
	if (T2->nextroot == T->traceno) {
	  T2->nextroot = T->nextroot;  /* Unlink from chain. */
	  break;
	}
    }
  }
}